

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::addConstraintElem(Molecule *this,ConstraintElem *cp)

{
  pointer *pppCVar1;
  iterator __position;
  __normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
  _Var2;
  ConstraintElem *local_10;
  
  local_10 = cp;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::ConstraintElem**,std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::ConstraintElem*const>>
                    ((this->constraintElems_).
                     super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->constraintElems_).
                     super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->constraintElems_).
       super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->constraintElems_).
        super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>::
      _M_realloc_insert<OpenMD::ConstraintElem*const&>
                ((vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>> *)
                 &this->constraintElems_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppCVar1 = &(this->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addConstraintElem(ConstraintElem* cp) {
    if (std::find(constraintElems_.begin(), constraintElems_.end(), cp) ==
        constraintElems_.end()) {
      constraintElems_.push_back(cp);
    }
  }